

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edithdu.c
# Opt level: O0

int ffcopy(fitsfile *infptr,fitsfile *outfptr,int morekeys,int *status)

{
  int iVar1;
  fitsfile *in_RCX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int nspace;
  int *in_stack_00000048;
  fitsfile *in_stack_00000050;
  fitsfile *in_stack_00000058;
  int *in_stack_00000100;
  fitsfile *in_stack_00000108;
  int *in_stack_00000b28;
  fitsfile *in_stack_00000b30;
  fitsfile *in_stack_00000b38;
  int *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  int local_4;
  
  if (in_RCX->HDUposition < 1) {
    if (in_RDI == in_RSI) {
      in_RCX->HDUposition = 0x65;
      local_4 = 0x65;
    }
    else {
      iVar1 = ffcphd(in_stack_00000058,in_stack_00000050,in_stack_00000048);
      if (iVar1 < 1) {
        if (in_EDX < 1) {
          iVar1 = ffghsp(in_RCX,(int *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)
                         ,in_stack_ffffffffffffffc8,(int *)0x1366f2);
          if (0 < iVar1) {
            return in_RCX->HDUposition;
          }
          if ((0 < in_stack_ffffffffffffffd4) &&
             (ffhdef(in_RCX,in_stack_ffffffffffffffd4,in_stack_ffffffffffffffc8),
             0x22 < in_stack_ffffffffffffffd4)) {
            ffwend(in_stack_00000108,in_stack_00000100);
          }
        }
        else {
          ffhdef(in_RCX,in_stack_ffffffffffffffd4,in_stack_ffffffffffffffc8);
        }
        ffcpdt(in_stack_00000b38,in_stack_00000b30,in_stack_00000b28);
        local_4 = in_RCX->HDUposition;
      }
      else {
        local_4 = in_RCX->HDUposition;
      }
    }
  }
  else {
    local_4 = in_RCX->HDUposition;
  }
  return local_4;
}

Assistant:

int ffcopy(fitsfile *infptr,    /* I - FITS file pointer to input file  */
           fitsfile *outfptr,   /* I - FITS file pointer to output file */
           int morekeys,        /* I - reserve space in output header   */
           int *status)         /* IO - error status     */
/*
  copy the CHDU from infptr to the CHDU of outfptr.
  This will also allocate space in the output header for MOREKY keywords
*/
{
    int nspace;
    
    if (*status > 0)
        return(*status);

    if (infptr == outfptr)
        return(*status = SAME_FILE);

    if (ffcphd(infptr, outfptr, status) > 0)  /* copy the header keywords */
       return(*status);

    if (morekeys > 0) {
      ffhdef(outfptr, morekeys, status); /* reserve space for more keywords */

    } else {
        if (ffghsp(infptr, NULL, &nspace, status) > 0) /* get existing space */
            return(*status);

        if (nspace > 0) {
            ffhdef(outfptr, nspace, status); /* preserve same amount of space */
            if (nspace >= 35) {  

	        /* There is at least 1 full empty FITS block in the header. */
	        /* Physically write the END keyword at the beginning of the */
	        /* last block to preserve this extra space now rather than */
		/* later.  This is needed by the stream: driver which cannot */
		/* seek back to the header to write the END keyword later. */

	        ffwend(outfptr, status);
            }
        }
    }

    ffcpdt(infptr, outfptr, status);  /* now copy the data unit */

    return(*status);
}